

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::FieldBase::setString(FieldBase *this,string *string)

{
  std::__cxx11::string::_M_assign((string *)&this->m_string);
  (this->m_metrics).m_length = 0;
  (this->m_metrics).m_checksum = 0;
  (this->m_data)._M_string_length = 0;
  *(this->m_data)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void setString(const std::string &string) {
    m_string = string;
    m_metrics = no_metrics();
    m_data.clear();
  }